

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O3

Value __thiscall jbcoin::STPath::getJson(STPath *this,int param_1)

{
  uint32_t *puVar1;
  ushort uVar2;
  uint uVar3;
  pointer pSVar4;
  Value *pVVar5;
  ValueHolder VVar6;
  ValueHolder *pVVar7;
  ValueHolder VVar8;
  ValueHolder VVar9;
  ValueHolder VVar10;
  uint uVar11;
  long lVar12;
  _Rb_tree_header *p_Var13;
  undefined8 extraout_RDX;
  Currency *extraout_RDX_00;
  Currency *extraout_RDX_01;
  Currency *extraout_RDX_02;
  Currency *extraout_RDX_03;
  Currency *currency;
  undefined8 extraout_RDX_04;
  undefined8 uVar14;
  ulong uVar15;
  ushort uVar16;
  undefined4 in_register_00000034;
  undefined8 *puVar17;
  uint *puVar18;
  undefined1 in_R9B;
  undefined8 *puVar19;
  byte bVar20;
  Value VVar21;
  Value elem;
  STPathElement it;
  ValueHolder local_d8;
  ushort local_d0;
  ValueHolder local_c8;
  uint local_c0;
  ValueHolder local_b8 [2];
  ValueHolder local_a8;
  ValueHolder local_a0;
  uint local_98;
  undefined8 *local_90;
  ulong local_88;
  uint local_80;
  undefined1 local_7c [20];
  jbcoin local_68 [20];
  undefined1 local_54 [36];
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  bVar20 = 0;
  *(ushort *)
   &(this->mPath).super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
    _M_impl.super__Vector_impl_data._M_finish =
       (ushort)*(undefined4 *)
                &(this->mPath).
                 super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
                 _M_impl.super__Vector_impl_data._M_finish & 0xfe00 | 6;
  pSVar4 = (pointer)operator_new(0x30);
  puVar1 = (pSVar4->mAccountID).pn + 1;
  (pSVar4->mAccountID).pn[3] = 0;
  (pSVar4->mAccountID).pn[4] = 0;
  (pSVar4->mCurrencyID).pn[0] = 0;
  (pSVar4->mCurrencyID).pn[1] = 0;
  pSVar4->mType = 0;
  (pSVar4->mAccountID).pn[0] = 0;
  (pSVar4->mAccountID).pn[1] = 0;
  (pSVar4->mAccountID).pn[2] = 0;
  *(uint32_t **)(pSVar4->mCurrencyID).pn = puVar1;
  *(uint32_t **)((pSVar4->mCurrencyID).pn + 2) = puVar1;
  *(undefined8 *)((pSVar4->mCurrencyID).pn + 4) = 0;
  (this->mPath).super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
  _M_impl.super__Vector_impl_data._M_start = pSVar4;
  puVar19 = *(undefined8 **)CONCAT44(in_register_00000034,param_1);
  local_90 = (undefined8 *)((undefined8 *)CONCAT44(in_register_00000034,param_1))[1];
  uVar14 = extraout_RDX;
  local_a8 = (ValueHolder)this;
  if (puVar19 != local_90) {
    do {
      puVar17 = puVar19;
      puVar18 = &local_80;
      for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
        *(undefined8 *)puVar18 = *puVar17;
        puVar17 = puVar17 + (ulong)bVar20 * -2 + 1;
        puVar18 = puVar18 + ((ulong)bVar20 * -2 + 1) * 2;
      }
      local_98 = local_98 & 0xfffffe00 | 7;
      local_a0.string_ = (char *)operator_new(0x30);
      uVar3 = local_80;
      uVar11 = local_c0;
      p_Var13 = &((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      *(char *)((long)local_a0 + 0) = '\0';
      *(char *)((long)local_a0 + 1) = '\0';
      *(char *)((long)local_a0 + 2) = '\0';
      *(char *)((long)local_a0 + 3) = '\0';
      *(char *)((long)local_a0 + 4) = '\0';
      *(char *)((long)local_a0 + 5) = '\0';
      *(char *)((long)local_a0 + 6) = '\0';
      *(char *)((long)local_a0 + 7) = '\0';
      *(undefined8 *)&((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var13->_M_header;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var13->_M_header
      ;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      uVar15 = (ulong)(int)local_80;
      uVar16 = (ushort)local_c0;
      local_c0 = CONCAT31(local_c0._1_3_,1);
      local_c8.uint_ = local_80;
      pVVar5 = Json::Value::resolveReference((Value *)&local_a0,"type",true);
      VVar6 = (ValueHolder)(pVVar5->value_).real_;
      pVVar5->value_ = local_c8;
      uVar2 = *(ushort *)&pVVar5->field_0x8;
      *(ushort *)&pVVar5->field_0x8 = (uVar16 & 0x100) + (uVar2 & 0xfe00) + 1;
      uVar11 = uVar2 & 0x1ff | uVar11 & 0xfe00;
      local_c0 = CONCAT22(local_c0._2_2_,(short)uVar11);
      local_c8 = VVar6;
      Json::Value::~Value((Value *)&local_c8);
      local_88 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                 (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                 (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                 (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38;
      strHex<unsigned_char*>((string *)&local_c8,(jbcoin *)&local_88,(uchar *)0x8,uVar11);
      uVar16 = local_d0 & 0xfe00;
      local_d0 = uVar16 + 0x104;
      Json::valueAllocator();
      VVar6._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                              (Json::valueAllocator::valueAllocator,local_c8.real_,(ulong)local_c0);
      VVar6._4_4_ = extraout_var;
      local_d8 = VVar6;
      pVVar7 = &Json::Value::resolveReference((Value *)&local_a0,"type_hex",true)->value_;
      local_d8 = *pVVar7;
      *pVVar7 = VVar6;
      uVar2 = *(ushort *)(pVVar7 + 1);
      *(ushort *)(pVVar7 + 1) = uVar2 & 0xfe00 | 0x104;
      local_d0 = uVar16 | uVar2 & 0x1ff;
      Json::Value::~Value((Value *)&local_d8);
      currency = extraout_RDX_00;
      if (local_c8 != local_b8) {
        operator_delete(local_c8.string_,(ulong)(local_b8[0].string_ + 1));
        currency = extraout_RDX_01;
      }
      if ((uVar15 & 1) != 0) {
        encodeToken_abi_cxx11_
                  ((string *)&local_c8,(jbcoin *)0x0,(uint8_t)local_7c,(void *)0x14,0,(bool)in_R9B);
        uVar16 = local_d0 & 0xfe00;
        local_d0 = uVar16 + 0x104;
        Json::valueAllocator();
        VVar8._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                                (Json::valueAllocator::valueAllocator,local_c8.real_,(ulong)local_c0
                                );
        VVar8._4_4_ = extraout_var_00;
        local_d8 = VVar8;
        pVVar7 = &Json::Value::resolveReference((Value *)&local_a0,"account",true)->value_;
        local_d8 = *pVVar7;
        *pVVar7 = VVar8;
        uVar2 = *(ushort *)(pVVar7 + 1);
        *(ushort *)(pVVar7 + 1) = uVar2 & 0xfe00 | 0x104;
        local_d0 = uVar16 | uVar2 & 0x1ff;
        Json::Value::~Value((Value *)&local_d8);
        currency = extraout_RDX_02;
        if (local_c8 != local_b8) {
          operator_delete(local_c8.string_,(ulong)(local_b8[0].string_ + 1));
          currency = extraout_RDX_03;
        }
      }
      if ((uVar3 & 0x10) != 0) {
        to_string_abi_cxx11_((string *)&local_c8,local_68,currency);
        uVar16 = local_d0 & 0xfe00;
        local_d0 = uVar16 + 0x104;
        Json::valueAllocator();
        VVar9._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                                (Json::valueAllocator::valueAllocator,local_c8.real_,(ulong)local_c0
                                );
        VVar9._4_4_ = extraout_var_01;
        local_d8 = VVar9;
        pVVar7 = &Json::Value::resolveReference((Value *)&local_a0,"currency",true)->value_;
        local_d8 = *pVVar7;
        *pVVar7 = VVar9;
        uVar2 = *(ushort *)(pVVar7 + 1);
        *(ushort *)(pVVar7 + 1) = uVar2 & 0xfe00 | 0x104;
        local_d0 = uVar16 | uVar2 & 0x1ff;
        Json::Value::~Value((Value *)&local_d8);
        if (local_c8 != local_b8) {
          operator_delete(local_c8.string_,(ulong)(local_b8[0].string_ + 1));
        }
      }
      if ((uVar3 & 0x20) != 0) {
        encodeToken_abi_cxx11_
                  ((string *)&local_c8,(jbcoin *)0x0,(uint8_t)local_54,(void *)0x14,0,(bool)in_R9B);
        uVar16 = local_d0 & 0xfe00;
        local_d0 = uVar16 + 0x104;
        Json::valueAllocator();
        VVar10._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                                 (Json::valueAllocator::valueAllocator,local_c8.real_,
                                  (ulong)local_c0);
        VVar10._4_4_ = extraout_var_02;
        local_d8 = VVar10;
        pVVar7 = &Json::Value::resolveReference((Value *)&local_a0,"issuer",true)->value_;
        local_d8 = *pVVar7;
        *pVVar7 = VVar10;
        uVar2 = *(ushort *)(pVVar7 + 1);
        *(ushort *)(pVVar7 + 1) = uVar2 & 0xfe00 | 0x104;
        local_d0 = uVar16 | uVar2 & 0x1ff;
        Json::Value::~Value((Value *)&local_d8);
        if (local_c8 != local_b8) {
          operator_delete(local_c8.string_,(ulong)(local_b8[0].string_ + 1));
        }
      }
      Json::Value::append((Value *)local_a8.map_,(Value *)&local_a0);
      Json::Value::~Value((Value *)&local_a0);
      puVar19 = puVar19 + 10;
      uVar14 = extraout_RDX_04;
    } while (puVar19 != local_90);
  }
  VVar21._8_8_ = uVar14;
  VVar21.value_.real_ = local_a8.real_;
  return VVar21;
}

Assistant:

Json::Value
STPath::getJson (int) const
{
    Json::Value ret (Json::arrayValue);

    for (auto it: mPath)
    {
        Json::Value elem (Json::objectValue);
        int         iType   = it.getNodeType ();

        elem[jss::type]      = iType;
        elem[jss::type_hex]  = strHex (iType);

        if (iType & STPathElement::typeAccount)
            elem[jss::account]  = to_string (it.getAccountID ());

        if (iType & STPathElement::typeCurrency)
            elem[jss::currency] = to_string (it.getCurrency ());

        if (iType & STPathElement::typeIssuer)
            elem[jss::issuer]   = to_string (it.getIssuerID ());

        ret.append (elem);
    }

    return ret;
}